

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O3

XXH64_hash_t XXH_INLINE_XXH3_64bits_withSeed(void *input,size_t len,XXH64_hash_t seed)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  xxh_u8 *pxVar54;
  XXH64_hash_t XVar55;
  XXH64_hash_t in_RCX;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  XXH3_accWidth_e in_R9D;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  undefined1 (*acc) [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  xxh_u8 secret [192];
  xxh_u64 acc_1 [8];
  undefined1 local_180 [3] [64];
  undefined1 local_c0 [2] [64];
  undefined1 auVar67 [32];
  
  acc = local_180;
  if (len < 0x11) {
    if (8 < len) {
      uVar57 = 0xaf56bc3b0996523a - seed ^ *(ulong *)((long)input + (len - 8));
      uVar56 = seed + 0x6782737bea4239b9 ^ *input;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar57;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar56;
      uVar56 = (SUB168(auVar2 * auVar28,8) ^ SUB168(auVar2 * auVar28,0)) +
               len + uVar57 +
               (uVar56 >> 0x38 | (uVar56 & 0xff000000000000) >> 0x28 |
                (uVar56 & 0xff0000000000) >> 0x18 | (uVar56 & 0xff00000000) >> 8 |
                (uVar56 & 0xff000000) << 8 | (uVar56 & 0xff0000) << 0x18 | (uVar56 & 0xff00) << 0x28
               | uVar56 << 0x38);
      uVar56 = uVar56 >> 0x25 ^ uVar56;
      goto LAB_001090f1;
    }
    if (3 < len) {
      XVar55 = XXH3_len_4to8_64b((xxh_u8 *)input,len,(xxh_u8 *)seed,in_RCX);
      return XVar55;
    }
    if (len != 0) {
      XVar55 = XXH3_len_1to3_64b((xxh_u8 *)input,len,(xxh_u8 *)seed,in_RCX);
      return XVar55;
    }
    uVar56 = seed + 0x9e3779b185ebca87 ^ 0x8726f9105dc21ddc;
  }
  else {
    if (0x80 < len) {
      if (0xf0 < len) {
        if (seed == 0) {
          auVar70 = vmovdqu64_avx512f(_DAT_0019dc40);
          local_180[0] = vmovdqa64_avx512f(auVar70);
          XXH3_hashLong_internal_loop((xxh_u64 *)local_180,(xxh_u8 *)input,len,kSecret,0,in_R9D);
          pxVar54 = kSecret;
        }
        else {
          auVar65 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar80._8_8_ = 0xc;
          auVar80._0_8_ = 0xc;
          auVar80._16_8_ = 0xc;
          auVar80._24_8_ = 0xc;
          auVar84._8_8_ = 4;
          auVar84._0_8_ = 4;
          auVar84._16_8_ = 4;
          auVar84._24_8_ = 4;
          auVar66 = vpbroadcastq_avx512vl();
          lVar63 = 0xc;
          do {
            uVar56 = vpcmpuq_avx512vl(auVar65,auVar80,1);
            uVar56 = uVar56 & 0xf;
            auVar88 = vpsllq_avx2(auVar65,4);
            auVar65 = vpaddq_avx2(auVar65,auVar84);
            lVar63 = lVar63 + -4;
            auVar67 = vpgatherqq_avx512vl(0xbe4ba423396cfeb8);
            auVar68._8_8_ = (ulong)((byte)(uVar56 >> 1) & 1) * auVar67._8_8_;
            auVar68._0_8_ = (ulong)((byte)uVar56 & 1) * auVar67._0_8_;
            auVar68._16_8_ = (ulong)((byte)(uVar56 >> 2) & 1) * auVar67._16_8_;
            auVar68._24_8_ = (uVar56 >> 3) * auVar67._24_8_;
            auVar67 = vpaddq_avx2(auVar68,auVar66);
            vpscatterqq_avx512vl(ZEXT832(local_180) + auVar88,uVar56,auVar67);
            auVar67 = vpgatherqq_avx512vl(0x1cad21f72c81017c);
            auVar69._8_8_ = (ulong)((byte)(uVar56 >> 1) & 1) * auVar67._8_8_;
            auVar69._0_8_ = (ulong)((byte)uVar56 & 1) * auVar67._0_8_;
            auVar69._16_8_ = (ulong)((byte)(uVar56 >> 2) & 1) * auVar67._16_8_;
            auVar69._24_8_ = (uVar56 >> 3) * auVar67._24_8_;
            auVar67 = vpsubq_avx2(auVar69,auVar66);
            vpscatterqq_avx512vl(ZEXT832(local_180) + ZEXT832(8) + auVar88,uVar56,auVar67);
          } while (lVar63 != 0);
          auVar70 = vmovdqu64_avx512f(_DAT_0019dc40);
          acc = local_c0;
          local_c0[0] = vmovdqa64_avx512f(auVar70);
          XXH3_hashLong_internal_loop
                    ((xxh_u64 *)acc,(xxh_u8 *)input,len,(xxh_u8 *)local_180,0,in_R9D);
          pxVar54 = local_180[0];
        }
        XVar55 = XXH3_mergeAccs((xxh_u64 *)acc,pxVar54 + 0xb,len * -0x61c8864e7a143579);
        return XVar55;
      }
      auVar70 = vmovdqa64_avx512f(kSecret._0_64_);
      auVar71 = vmovdqa64_avx512f(kSecret._64_64_);
      auVar72 = vpmovsxbq_avx512f(ZEXT816(0xf0d0b0907050301));
      auVar73 = vmovdqu64_avx512f(*input);
      auVar74 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)input + 0x40));
      auVar75 = vpbroadcastq_avx512f();
      auVar76 = vmovdqa64_avx512f(auVar70);
      auVar76 = vpermt2q_avx512f(auVar76,auVar72,auVar71);
      auVar72 = vpermi2q_avx512f(auVar72,auVar73,auVar74);
      auVar76 = vpsubq_avx512f(auVar76,auVar75);
      auVar72 = vpxorq_avx512f(auVar76,auVar72);
      uVar56 = vpextrq_avx(auVar72._0_16_,1);
      uVar58 = vpextrq_avx(auVar72._16_16_,1);
      auVar76 = vpmovsxbq_avx512f(ZEXT816(0xe0c0a0806040200));
      auVar70 = vpermt2q_avx512f(auVar70,auVar76,auVar71);
      auVar71 = vpermt2q_avx512f(auVar73,auVar76,auVar74);
      auVar65 = vextracti64x4_avx512f(auVar72,1);
      uVar59 = vpextrq_avx(auVar65._0_16_,1);
      uVar57 = vpextrq_avx(auVar65._16_16_,1);
      auVar70 = vpaddq_avx512f(auVar70,auVar75);
      auVar70 = vpxorq_avx512f(auVar70,auVar71);
      auVar66 = vextracti64x4_avx512f(auVar70,1);
      uVar60 = vpextrq_avx(auVar70._0_16_,1);
      uVar64 = vpextrq_avx(auVar66._16_16_,1);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar57;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar64;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = auVar65._16_8_;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = auVar66._16_8_;
      uVar57 = vpextrq_avx(auVar66._0_16_,1);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar59;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar57;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = auVar65._0_8_;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = auVar66._0_8_;
      uVar57 = vpextrq_avx(auVar70._16_16_,1);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar58;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar57;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = auVar72._16_8_;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = auVar70._16_8_;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = SUB168(auVar11 * auVar37,8) ^ SUB168(auVar11 * auVar37,0);
      auVar81._8_8_ = 0;
      auVar81._0_8_ = SUB168(auVar12 * auVar38,8) ^ SUB168(auVar12 * auVar38,0);
      auVar3 = vpunpcklqdq_avx(auVar81,auVar78);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar56;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar60;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = auVar72._0_8_;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = auVar70._0_8_;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = SUB168(auVar13 * auVar39,8) ^ SUB168(auVar13 * auVar39,0);
      auVar89._8_8_ = 0;
      auVar89._0_8_ = SUB168(auVar14 * auVar40,8) ^ SUB168(auVar14 * auVar40,0);
      auVar4 = vpunpcklqdq_avx(auVar89,auVar85);
      auVar65._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
      auVar65._16_16_ = ZEXT116(1) * auVar3;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = SUB168(auVar15 * auVar41,8) ^ SUB168(auVar15 * auVar41,0);
      auVar94._8_8_ = 0;
      auVar94._0_8_ = SUB168(auVar16 * auVar42,8) ^ SUB168(auVar16 * auVar42,0);
      auVar3 = vpunpcklqdq_avx(auVar94,auVar92);
      auVar86._8_8_ = 0;
      auVar86._0_8_ = SUB168(auVar17 * auVar43,8) ^ SUB168(auVar17 * auVar43,0);
      auVar90._8_8_ = 0;
      auVar90._0_8_ = SUB168(auVar18 * auVar44,8) ^ SUB168(auVar18 * auVar44,0);
      auVar4 = vpunpcklqdq_avx(auVar90,auVar86);
      auVar70 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar3,
                                               ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4)),auVar65,1
                          );
      auVar70 = vpaddq_avx512f(ZEXT864(len * -0x61c8864e7a143579),auVar70);
      auVar65 = vextracti64x4_avx512f(auVar70,1);
      auVar70 = vpaddq_avx512f(auVar70,ZEXT3264(auVar65));
      auVar3 = vpaddq_avx(auVar70._0_16_,auVar70._16_16_);
      auVar4 = vpshufd_avx(auVar3,0xee);
      auVar3 = vpaddq_avx(auVar3,auVar4);
      uVar56 = (auVar3._0_8_ >> 0x25 ^ auVar3._0_8_) * 0x165667919e3779f9;
      uVar56 = uVar56 >> 0x20 ^ uVar56;
      if (0x8f < len) {
        uVar58 = len >> 4 & 0xfffffff;
        vpmovsxbd_avx2(ZEXT816(0x7b6b5b4b3b2b1b0b));
        uVar57 = 9;
        if (9 < (uint)uVar58) {
          uVar57 = uVar58;
        }
        auVar70 = vpbroadcastq_avx512f();
        uVar59 = vpcmpuq_avx512f(auVar70,_DAT_0019d5c0,5);
        vpmovzxbd_avx2(ZEXT816(0xf0e0d0c0b0a09080));
        auVar71 = vpgatherdq_avx512f(*(undefined4 *)((long)input + uVar58));
        bVar1 = (byte)uVar59;
        auVar70._8_8_ = (ulong)((byte)(uVar59 >> 1) & 1) * auVar71._8_8_;
        auVar70._0_8_ = (ulong)(bVar1 & 1) * auVar71._0_8_;
        auVar70._16_8_ = (ulong)((byte)(uVar59 >> 2) & 1) * auVar71._16_8_;
        auVar70._24_8_ = (ulong)((byte)(uVar59 >> 3) & 1) * auVar71._24_8_;
        auVar70._32_8_ = (ulong)((byte)(uVar59 >> 4) & 1) * auVar71._32_8_;
        auVar70._40_8_ = (ulong)((byte)(uVar59 >> 5) & 1) * auVar71._40_8_;
        auVar70._48_8_ = (ulong)((byte)(uVar59 >> 6) & 1) * auVar71._48_8_;
        auVar70._56_8_ = (uVar59 >> 7) * auVar71._56_8_;
        auVar71 = vpgatherdq_avx512f(*(undefined4 *)((long)input + uVar58 + 8));
        auVar72._8_8_ = (ulong)((byte)(uVar59 >> 1) & 1) * auVar71._8_8_;
        auVar72._0_8_ = (ulong)(bVar1 & 1) * auVar71._0_8_;
        auVar72._16_8_ = (ulong)((byte)(uVar59 >> 2) & 1) * auVar71._16_8_;
        auVar72._24_8_ = (ulong)((byte)(uVar59 >> 3) & 1) * auVar71._24_8_;
        auVar72._32_8_ = (ulong)((byte)(uVar59 >> 4) & 1) * auVar71._32_8_;
        auVar72._40_8_ = (ulong)((byte)(uVar59 >> 5) & 1) * auVar71._40_8_;
        auVar72._48_8_ = (ulong)((byte)(uVar59 >> 6) & 1) * auVar71._48_8_;
        auVar72._56_8_ = (uVar59 >> 7) * auVar71._56_8_;
        auVar73 = vpgatherdq_avx512f(*(undefined4 *)(&DAT_0019db03 + uVar58));
        auVar71._8_8_ = (ulong)((byte)(uVar59 >> 1) & 1) * auVar73._8_8_;
        auVar71._0_8_ = (ulong)(bVar1 & 1) * auVar73._0_8_;
        auVar71._16_8_ = (ulong)((byte)(uVar59 >> 2) & 1) * auVar73._16_8_;
        auVar71._24_8_ = (ulong)((byte)(uVar59 >> 3) & 1) * auVar73._24_8_;
        auVar71._32_8_ = (ulong)((byte)(uVar59 >> 4) & 1) * auVar73._32_8_;
        auVar71._40_8_ = (ulong)((byte)(uVar59 >> 5) & 1) * auVar73._40_8_;
        auVar71._48_8_ = (ulong)((byte)(uVar59 >> 6) & 1) * auVar73._48_8_;
        auVar71._56_8_ = (uVar59 >> 7) * auVar73._56_8_;
        auVar73 = vpgatherdq_avx512f(*(undefined4 *)(&UNK_0019db77 + uVar57));
        auVar74._8_8_ = (ulong)((byte)(uVar59 >> 1) & 1) * auVar73._8_8_;
        auVar74._0_8_ = (ulong)(bVar1 & 1) * auVar73._0_8_;
        auVar74._16_8_ = (ulong)((byte)(uVar59 >> 2) & 1) * auVar73._16_8_;
        auVar74._24_8_ = (ulong)((byte)(uVar59 >> 3) & 1) * auVar73._24_8_;
        auVar74._32_8_ = (ulong)((byte)(uVar59 >> 4) & 1) * auVar73._32_8_;
        auVar74._40_8_ = (ulong)((byte)(uVar59 >> 5) & 1) * auVar73._40_8_;
        auVar74._48_8_ = (ulong)((byte)(uVar59 >> 6) & 1) * auVar73._48_8_;
        auVar74._56_8_ = (uVar59 >> 7) * auVar73._56_8_;
        auVar71 = vpaddq_avx512f(auVar71,auVar75);
        auVar70 = vpxorq_avx512f(auVar71,auVar70);
        auVar71 = vpsubq_avx512f(auVar74,auVar75);
        auVar71 = vpxorq_avx512f(auVar71,auVar72);
        uVar60 = vpextrq_avx(auVar70._0_16_,1);
        auVar65 = vextracti64x4_avx512f(auVar71,1);
        uVar64 = vpextrq_avx(auVar70._16_16_,1);
        auVar66 = vextracti64x4_avx512f(auVar70,1);
        uVar57 = vpextrq_avx(auVar71._0_16_,1);
        uVar62 = vpextrq_avx(auVar66._0_16_,1);
        uVar61 = vpextrq_avx(auVar66._16_16_,1);
        uVar58 = vpextrq_avx(auVar65._16_16_,1);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = uVar58;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = uVar61;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = auVar65._16_8_;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = auVar66._16_8_;
        uVar58 = vpextrq_avx(auVar65._0_16_,1);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar58;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = uVar62;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = auVar65._0_8_;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = auVar66._0_8_;
        uVar58 = vpextrq_avx(auVar71._16_16_,1);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = uVar58;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = uVar64;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = auVar71._16_8_;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = auVar70._16_8_;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar57;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = uVar60;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = auVar71._0_8_;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = auVar70._0_8_;
        auVar77._8_8_ = 0;
        auVar77._0_8_ = SUB168(auVar19 * auVar45,8) ^ SUB168(auVar19 * auVar45,0);
        auVar79._8_8_ = 0;
        auVar79._0_8_ = SUB168(auVar20 * auVar46,8) ^ SUB168(auVar20 * auVar46,0);
        auVar3 = vpunpcklqdq_avx(auVar79,auVar77);
        auVar82._8_8_ = 0;
        auVar82._0_8_ = SUB168(auVar21 * auVar47,8) ^ SUB168(auVar21 * auVar47,0);
        auVar87._8_8_ = 0;
        auVar87._0_8_ = SUB168(auVar22 * auVar48,8) ^ SUB168(auVar22 * auVar48,0);
        auVar4 = vpunpcklqdq_avx(auVar87,auVar82);
        auVar66._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
        auVar66._16_16_ = ZEXT116(1) * auVar3;
        auVar91._8_8_ = 0;
        auVar91._0_8_ = SUB168(auVar23 * auVar49,8) ^ SUB168(auVar23 * auVar49,0);
        auVar93._8_8_ = 0;
        auVar93._0_8_ = SUB168(auVar24 * auVar50,8) ^ SUB168(auVar24 * auVar50,0);
        auVar3 = vpunpcklqdq_avx(auVar93,auVar91);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = SUB168(auVar26 * auVar52,8) ^ SUB168(auVar26 * auVar52,0);
        auVar95._8_8_ = 0;
        auVar95._0_8_ = SUB168(auVar25 * auVar51,8) ^ SUB168(auVar25 * auVar51,0);
        auVar4 = vpunpcklqdq_avx(auVar83,auVar95);
        auVar70 = vinserti64x4_avx512f
                            (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar3,
                                                 ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4)),auVar66
                             ,1);
        auVar70 = vpaddq_avx512f(ZEXT864(uVar56),auVar70);
        auVar73._0_8_ = (ulong)(bVar1 & 1) * auVar70._0_8_ | !(bool)(bVar1 & 1) * uVar56;
        auVar73._8_8_ = (ulong)((byte)(uVar59 >> 1) & 1) * auVar70._8_8_;
        auVar73._16_8_ = (ulong)((byte)(uVar59 >> 2) & 1) * auVar70._16_8_;
        auVar73._24_8_ = (ulong)((byte)(uVar59 >> 3) & 1) * auVar70._24_8_;
        auVar73._32_8_ = (ulong)((byte)(uVar59 >> 4) & 1) * auVar70._32_8_;
        auVar73._40_8_ = (ulong)((byte)(uVar59 >> 5) & 1) * auVar70._40_8_;
        auVar73._48_8_ = (ulong)((byte)(uVar59 >> 6) & 1) * auVar70._48_8_;
        auVar73._56_8_ = (uVar59 >> 7) * auVar70._56_8_;
        auVar65 = vextracti64x4_avx512f(auVar73,1);
        auVar70 = vpaddq_avx512f(auVar73,ZEXT3264(auVar65));
        auVar3 = vpaddq_avx(auVar70._0_16_,auVar70._16_16_);
        auVar4 = vpshufd_avx(auVar3,0xee);
        auVar3 = vpaddq_avx(auVar3,auVar4);
        uVar56 = auVar3._0_8_;
      }
      auVar27._8_8_ = 0;
      auVar27._0_8_ = 0xebd33483acc5ea64 - seed ^ *(ulong *)((long)input + (len - 8));
      auVar53._8_8_ = 0;
      auVar53._0_8_ = seed + 0x7378d9c97e9fc831 ^ *(ulong *)((long)input + (len - 0x10));
      uVar56 = (SUB168(auVar27 * auVar53,8) ^ SUB168(auVar27 * auVar53,0)) + uVar56;
      uVar56 = uVar56 >> 0x25 ^ uVar56;
      goto LAB_001090f1;
    }
    lVar63 = len * -0x61c8864e7a143579;
    if (0x20 < len) {
      if (0x40 < len) {
        if (0x60 < len) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = 0x1d4f0bc7c7bbdcf9 - seed ^ *(ulong *)((long)input + 0x38);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = seed + 0x3f349ce33f76faa8 ^ *(ulong *)((long)input + 0x30);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = 0x647378d9c97e9fc8 - seed ^ *(ulong *)((long)input + (len - 0x38));
          auVar30._8_8_ = 0;
          auVar30._0_8_ = seed + 0x3159b4cd4be0518a ^ *(ulong *)((long)input + (len - 0x40));
          lVar63 = lVar63 + (SUB168(auVar3 * auVar29,8) ^ SUB168(auVar3 * auVar29,0)) +
                   (SUB168(auVar4 * auVar30,8) ^ SUB168(auVar4 * auVar30,0));
        }
        auVar5._8_8_ = 0;
        auVar5._0_8_ = 0xa32e531b8b65d088 - seed ^ *(ulong *)((long)input + 0x28);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = seed + 0xcb00c391bb52283c ^ *(ulong *)((long)input + 0x20);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = 0xd8acdea946ef1938 - seed ^ *(ulong *)((long)input + (len - 0x28));
        auVar32._8_8_ = 0;
        auVar32._0_8_ = seed + 0x4ef90da297486471 ^ *(ulong *)((long)input + (len - 0x30));
        lVar63 = (SUB168(auVar6 * auVar32,8) ^ SUB168(auVar6 * auVar32,0)) +
                 (SUB168(auVar5 * auVar31,8) ^ SUB168(auVar5 * auVar31,0)) + lVar63;
      }
      auVar7._8_8_ = 0;
      auVar7._0_8_ = 0x2172ffcc7dd05a82 - seed ^ *(ulong *)((long)input + 0x18);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = seed + 0x78e5c0cc4ee679cb ^ *(ulong *)((long)input + 0x10);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = 0x4c263a81e69035e0 - seed ^ *(ulong *)((long)input + (len - 0x18));
      auVar34._8_8_ = 0;
      auVar34._0_8_ = seed + 0x8e2443f7744608b8 ^ *(ulong *)((long)input + (len - 0x20));
      lVar63 = (SUB168(auVar8 * auVar34,8) ^ SUB168(auVar8 * auVar34,0)) +
               (SUB168(auVar7 * auVar33,8) ^ SUB168(auVar7 * auVar33,0)) + lVar63;
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = 0x1cad21f72c81017c - seed ^ *(ulong *)((long)input + 8);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = seed + 0xbe4ba423396cfeb8 ^ *input;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = 0x1f67b3b7a4a44072 - seed ^ *(ulong *)((long)input + (len - 8));
    auVar36._8_8_ = 0;
    auVar36._0_8_ = seed + 0xdb979083e96dd4de ^ *(ulong *)((long)input + (len - 0x10));
    uVar56 = (SUB168(auVar10 * auVar36,8) ^ SUB168(auVar10 * auVar36,0)) +
             (SUB168(auVar9 * auVar35,8) ^ SUB168(auVar9 * auVar35,0)) + lVar63;
  }
  uVar56 = uVar56 >> 0x25 ^ uVar56;
LAB_001090f1:
  return uVar56 * 0x165667919e3779f9 >> 0x20 ^ uVar56 * 0x165667919e3779f9;
}

Assistant:

XXH_PUBLIC_API XXH64_hash_t
XXH3_64bits_withSeed(const void* input, size_t len, XXH64_hash_t seed)
{
    if (len <= 16) return XXH3_len_0to16_64b((const xxh_u8*)input, len, kSecret, seed);
    if (len <= 128) return XXH3_len_17to128_64b((const xxh_u8*)input, len, kSecret, sizeof(kSecret), seed);
    if (len <= XXH3_MIDSIZE_MAX) return XXH3_len_129to240_64b((const xxh_u8*)input, len, kSecret, sizeof(kSecret), seed);
    return XXH3_hashLong_64b_withSeed((const xxh_u8*)input, len, seed);
}